

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O2

void qAddPostRoutine(QtCleanUpFunction p)

{
  Type *this;
  
  this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_postRList>_>::operator()
                   ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_postRList>_>
                     *)p);
  if (this != (Type *)0x0) {
    QBasicMutex::lock(&globalRoutinesMutex);
    QList<void_(*)()>::prepend(this,p);
    QBasicMutex::unlock(&globalRoutinesMutex);
    return;
  }
  return;
}

Assistant:

void qAddPostRoutine(QtCleanUpFunction p)
{
    QVFuncList *list = postRList();
    if (!list)
        return;
    const auto locker = qt_scoped_lock(globalRoutinesMutex);
    list->prepend(p);
}